

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

float __thiscall units::detail::power_const<float>(detail *this,float val,int power)

{
  int power_00;
  float fVar1;
  float local_28;
  float local_24;
  float local_1c;
  float local_18;
  int power_local;
  float val_local;
  
  power_00 = (int)this;
  if (power_00 < 2) {
    if (power_00 < -1) {
      fVar1 = power_const<float>((detail *)((long)-power_00 / 2 & 0xffffffff),val,power);
      fVar1 = sqr_power<float>(fVar1);
      local_24 = val;
      if (-power_00 % 2 == 0) {
        local_24 = 1.0;
      }
      local_28 = 1.0 / (fVar1 * local_24);
    }
    else {
      local_28 = power_const_small<float>(val,power_00);
    }
    local_1c = local_28;
  }
  else {
    fVar1 = power_const<float>((detail *)((long)power_00 / 2 & 0xffffffff),val,power);
    local_1c = sqr_power<float>(fVar1);
    local_18 = val;
    if (power_00 % 2 == 0) {
      local_18 = 1.0;
    }
    local_1c = local_1c * local_18;
  }
  return local_1c;
}

Assistant:

constexpr X power_const(X val, int power)
    {
        return (power > 1) ? sqr_power(power_const(val, power / 2)) *
                (power % 2 == 0 ? X{1.0} : val) :
            (power < -1) ? X{1.0} /
                (sqr_power(power_const(val, (-power) / 2)) *
                 ((-power) % 2 == 0 ? X{1.0} : val)) :
                           power_const_small(val, power);
    }